

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# touzet_depth_pruning_tree_index_impl.h
# Opt level: O3

double __thiscall
ted::
TouzetDepthPruningTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>::
tree_dist(TouzetDepthPruningTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
          *this,TreeIndexAll *t1,TreeIndexAll *t2,int x,int y,int k,int e)

{
  BandMatrix<double> *this_00;
  longlong *plVar1;
  double dVar2;
  int iVar3;
  uint uVar4;
  pointer piVar5;
  pointer piVar6;
  pointer pvVar7;
  pointer piVar8;
  size_t sVar9;
  bool bVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  size_t row;
  double *pdVar15;
  int iVar16;
  size_t row_00;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  ulong extraout_RDX;
  size_t sVar21;
  int iVar22;
  ulong uVar23;
  int iVar24;
  int iVar25;
  ulong uVar26;
  int iVar27;
  long lVar28;
  ulong uVar29;
  int iVar30;
  ulong uVar31;
  long lVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double local_128;
  ulong local_d0;
  
  uVar29 = (ulong)x;
  iVar3 = (t1->super_PostLToSize).postl_to_size_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar29];
  row = (size_t)iVar3;
  uVar4 = (t2->super_PostLToSize).postl_to_size_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start[y];
  this_00 = &(this->
             super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
             ).
             super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
             .fd_;
  pdVar15 = data_structures::Matrix<double>::at
                      (&this_00->super_Matrix<double>,0,
                       (this->
                       super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                       ).
                       super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                       .fd_.band_width_);
  *pdVar15 = 0.0;
  uVar13 = e;
  if ((int)uVar4 < e) {
    uVar13 = uVar4;
  }
  if (0 < (int)uVar13) {
    uVar31 = 1;
    do {
      pdVar15 = data_structures::Matrix<double>::read_at
                          (&this_00->super_Matrix<double>,0,
                           (uVar31 + (this->
                                     super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                     ).
                                     super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                     .fd_.band_width_) - 1);
      dVar33 = *pdVar15;
      pdVar15 = data_structures::Matrix<double>::at
                          (&this_00->super_Matrix<double>,0,
                           (this->
                           super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                           ).
                           super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                           .fd_.band_width_ + uVar31);
      *pdVar15 = dVar33 + 1.0;
      uVar31 = uVar31 + 1;
    } while (uVar13 + 1 != uVar31);
  }
  if (e < (int)uVar4) {
    pdVar15 = data_structures::Matrix<double>::at
                        (&this_00->super_Matrix<double>,0,
                         (long)e + (this->
                                   super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                   ).
                                   super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                   .fd_.band_width_ + 1);
    *pdVar15 = INFINITY;
  }
  iVar22 = e;
  if (iVar3 < e) {
    iVar22 = iVar3;
  }
  if (0 < iVar22) {
    sVar21 = 1;
    do {
      pdVar15 = data_structures::Matrix<double>::read_at
                          (&this_00->super_Matrix<double>,sVar21 - 1,
                           (this->
                           super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                           ).
                           super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                           .fd_.band_width_ - (sVar21 - 1));
      dVar33 = *pdVar15;
      pdVar15 = data_structures::Matrix<double>::at
                          (&this_00->super_Matrix<double>,sVar21,
                           (this->
                           super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                           ).
                           super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                           .fd_.band_width_ - sVar21);
      *pdVar15 = dVar33 + 1.0;
      sVar21 = sVar21 + 1;
    } while (sVar21 != iVar22 + 1);
  }
  if (e < iVar3) {
    pdVar15 = data_structures::Matrix<double>::at
                        (&this_00->super_Matrix<double>,(long)(e + 1),
                         (this->
                         super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         ).
                         super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         .fd_.band_width_ - (long)(e + 1));
    *pdVar15 = INFINITY;
  }
  piVar5 = (t1->super_PostLToDepth).postl_to_depth_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar20 = (long)(t1->super_PostLToDepth).postl_to_depth_.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish - (long)piVar5 >> 2;
  uVar31 = uVar20;
  uVar17 = uVar29;
  if (uVar29 < uVar20) {
    piVar6 = (t1->super_PostLToSubtreeMaxDepth).postl_to_subtree_max_depth_.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    uVar31 = (long)(t1->super_PostLToSubtreeMaxDepth).postl_to_subtree_max_depth_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_finish - (long)piVar6 >> 2;
    if (uVar29 < uVar31) {
      iVar12 = e + 1;
      iVar22 = piVar6[uVar29];
      iVar24 = piVar5[uVar29] + iVar12;
      if (iVar22 < piVar5[uVar29] + iVar12) {
        iVar24 = iVar22;
      }
      uVar23 = (ulong)iVar24;
      pvVar7 = (t1->super_InvertedListDepthToPostL).inverted_list_depth_to_postl_.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar31 = ((long)(t1->super_InvertedListDepthToPostL).inverted_list_depth_to_postl_.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7 >> 3) *
               -0x5555555555555555;
      uVar17 = uVar23;
      if (uVar23 <= uVar31 && uVar31 - uVar23 != 0) {
        piVar6 = *(pointer *)&pvVar7[uVar23].super__Vector_base<int,_std::allocator<int>_>._M_impl;
        piVar8 = *(pointer *)
                  ((long)&pvVar7[uVar23].super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
        uVar31 = (long)piVar8 - (long)piVar6 >> 2;
        uVar17 = uVar31;
        if (piVar8 != piVar6) {
          lVar28 = uVar29 - row;
          uVar26 = 0;
          do {
            iVar27 = (int)lVar28;
            iVar22 = piVar6[uVar26] - iVar27;
            if (iVar22 != 0 && iVar27 <= piVar6[uVar26]) {
              uVar31 = uVar20;
              uVar17 = lVar28 + 1U;
              if (lVar28 + 1U < uVar20) {
                if (piVar5[lVar28 + 1] <= iVar24) {
                  iVar22 = 1;
                }
                if (iVar3 < iVar22) goto LAB_0010c34a;
                iVar25 = (int)uVar26 + (uint)(iVar24 <= piVar5[lVar28 + 1]);
                goto LAB_0010bf0f;
              }
              break;
            }
            uVar26 = uVar26 + 1;
          } while (uVar31 != uVar26);
        }
      }
    }
  }
LAB_0010c446:
  do {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar17,
               uVar31);
    uVar31 = extraout_RDX;
    uVar17 = local_d0;
  } while( true );
LAB_0010bf0f:
  sVar21 = (size_t)iVar22;
  if (e - iVar22 < -1) {
    pdVar15 = data_structures::Matrix<double>::at
                        (&this_00->super_Matrix<double>,sVar21,
                         ((long)(~e + iVar22) - sVar21) +
                         (this->
                         super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         ).
                         super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         .fd_.band_width_);
    *pdVar15 = INFINITY;
  }
  uVar13 = iVar22 - e;
  if ((int)uVar13 < 2) {
    uVar13 = 1;
  }
  uVar18 = e + iVar22;
  uVar11 = uVar18;
  if ((int)uVar4 < (int)uVar18) {
    uVar11 = uVar4;
  }
  local_d0 = uVar23;
  if ((int)uVar13 <= (int)uVar11) {
    row_00 = (size_t)(iVar27 + iVar22);
    uVar17 = (ulong)(iVar27 + -1 + iVar22);
    uVar20 = (ulong)uVar13;
    iVar30 = ((((x + uVar4) - iVar3) - y) + iVar22) - uVar13;
    do {
      if ((iVar22 == iVar3) && (uVar11 == uVar20)) break;
      plVar1 = &(this->
                super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                ).
                super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                .
                super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                .subproblem_counter_;
      *plVar1 = *plVar1 + 1;
      iVar19 = -iVar30;
      if (0 < iVar30) {
        iVar19 = iVar30;
      }
      sVar9 = (this->
              super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
              ).
              super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
              .fd_.band_width_;
      if (k < iVar19) {
        pdVar15 = data_structures::Matrix<double>::at
                            (&this_00->super_Matrix<double>,sVar21,sVar9 + -sVar21 + uVar20);
        *pdVar15 = INFINITY;
      }
      else {
        lVar28 = -sVar21 + uVar20;
        pdVar15 = data_structures::Matrix<double>::read_at
                            (&this_00->super_Matrix<double>,sVar21,(sVar9 + lVar28) - 1);
        lVar32 = (long)(int)((y - uVar4) + (int)uVar20);
        dVar33 = *pdVar15 + 1.0;
        if (INFINITY <= dVar33) {
          dVar33 = INFINITY;
        }
        pdVar15 = data_structures::Matrix<double>::read_at
                            (&(this->
                              super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                              ).
                              super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                              .td_.super_Matrix<double>,row_00,
                             (lVar32 - row_00) +
                             (this->
                             super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                             ).
                             super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                             .td_.band_width_);
        dVar2 = *pdVar15;
        iVar19 = (t1->super_PostLToSize).postl_to_size_.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[row_00];
        uVar13 = (t2->super_PostLToSize).postl_to_size_.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[lVar32];
        iVar14 = iVar22 - iVar19;
        if ((iVar14 != 0) || (dVar34 = 0.0, uVar20 != uVar13)) {
          uVar31 = -uVar13 + uVar20;
          iVar19 = ~(iVar19 + e) + iVar22;
          if (iVar19 < 1) {
            iVar19 = 0;
          }
          dVar34 = INFINITY;
          iVar16 = (int)uVar31;
          if (iVar19 <= iVar16) {
            uVar13 = iVar12 + iVar14;
            if ((int)uVar4 < iVar12 + iVar14) {
              uVar13 = uVar4;
            }
            dVar34 = INFINITY;
            if (iVar16 <= (int)uVar13) {
              pdVar15 = data_structures::Matrix<double>::read_at
                                  (&this_00->super_Matrix<double>,(long)iVar14,
                                   ((uVar31 & 0xffffffff) - (long)iVar14) +
                                   (this->
                                   super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                   ).
                                   super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                   .fd_.band_width_);
              dVar34 = *pdVar15;
            }
          }
        }
        dVar35 = dVar2 + dVar34;
        if (dVar33 <= dVar2 + dVar34) {
          dVar35 = dVar33;
        }
        local_128 = dVar35;
        if (iVar22 == 1) {
LAB_0010c16c:
          pdVar15 = data_structures::Matrix<double>::read_at
                              (&this_00->super_Matrix<double>,(ulong)(iVar22 - 1),
                               (uVar20 - (iVar22 - 1)) +
                               (this->
                               super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                               ).
                               super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                               .fd_.band_width_);
          local_128 = *pdVar15 + 1.0;
          if (dVar35 <= *pdVar15 + 1.0) {
            local_128 = dVar35;
          }
        }
        else if (1 < iVar22) {
          piVar5 = (t1->super_PostLToDepth).postl_to_depth_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          uVar31 = (long)(t1->super_PostLToDepth).postl_to_depth_.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
          if (uVar31 <= uVar17) goto LAB_0010c446;
          if (piVar5[uVar17] - piVar5[uVar29] <= iVar12) goto LAB_0010c16c;
        }
        pdVar15 = data_structures::Matrix<double>::at
                            (&this_00->super_Matrix<double>,sVar21,
                             lVar28 + (this->
                                      super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                      ).
                                      super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                      .fd_.band_width_);
        if (local_128 <= (double)e) {
          *pdVar15 = local_128;
        }
        else {
          *pdVar15 = INFINITY;
        }
      }
      uVar20 = uVar20 + 1;
      iVar30 = iVar30 + -1;
    } while (uVar11 + 1 != uVar20);
  }
  if ((int)uVar18 < (int)uVar4) {
    pdVar15 = data_structures::Matrix<double>::at
                        (&this_00->super_Matrix<double>,sVar21,
                         ((long)(int)(uVar18 + 1) - sVar21) +
                         (this->
                         super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         ).
                         super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         .fd_.band_width_);
    *pdVar15 = INFINITY;
  }
  iVar30 = iVar22 + 1;
  bVar10 = iVar22 < iVar3;
  iVar22 = iVar30;
  if (bVar10) {
    uVar17 = (ulong)(iVar27 + iVar30);
    piVar5 = (t1->super_PostLToDepth).postl_to_depth_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar31 = (long)(t1->super_PostLToDepth).postl_to_depth_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_finish - (long)piVar5 >> 2;
    if (uVar31 <= uVar17) goto LAB_0010c446;
    iVar30 = piVar5[uVar17];
    if (iVar24 < iVar30) {
      pvVar7 = (t1->super_InvertedListDepthToPostL).inverted_list_depth_to_postl_.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar31 = ((long)(t1->super_InvertedListDepthToPostL).inverted_list_depth_to_postl_.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7 >> 3) *
               -0x5555555555555555;
      uVar17 = uVar23;
      if (uVar31 < uVar23 || uVar31 - uVar23 == 0) goto LAB_0010c446;
      uVar17 = (ulong)iVar25;
      lVar28 = *(long *)&pvVar7[uVar23].super__Vector_base<int,_std::allocator<int>_>._M_impl;
      uVar31 = (long)*(pointer *)
                      ((long)&pvVar7[uVar23].super__Vector_base<int,_std::allocator<int>_>._M_impl +
                      8) - lVar28 >> 2;
      if (uVar31 <= uVar17) goto LAB_0010c446;
      iVar25 = iVar25 + 1;
      iVar22 = *(int *)(lVar28 + uVar17 * 4) - iVar27;
    }
    else {
      iVar25 = iVar25 + (uint)(iVar30 == iVar24);
    }
  }
  if (iVar3 < iVar22) {
LAB_0010c34a:
    plVar1 = &(this->
              super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
              ).
              super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
              .
              super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
              .subproblem_counter_;
    *plVar1 = *plVar1 + 1;
    sVar21 = row - 1;
    pdVar15 = data_structures::Matrix<double>::read_at
                        (&this_00->super_Matrix<double>,sVar21,
                         ((long)(int)uVar4 - sVar21) +
                         (this->
                         super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         ).
                         super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         .fd_.band_width_);
    dVar33 = *pdVar15;
    lVar28 = (long)(int)uVar4 + -1;
    pdVar15 = data_structures::Matrix<double>::read_at
                        (&this_00->super_Matrix<double>,row,
                         (lVar28 - row) +
                         (this->
                         super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         ).
                         super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         .fd_.band_width_);
    dVar2 = *pdVar15;
    pdVar15 = data_structures::Matrix<double>::read_at
                        (&this_00->super_Matrix<double>,sVar21,
                         (lVar28 - sVar21) +
                         (this->
                         super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         ).
                         super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         .fd_.band_width_);
    dVar34 = 0.0;
    if ((t1->super_PostLToLabelId).postl_to_label_id_.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar29] !=
        (t2->super_PostLToLabelId).postl_to_label_id_.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_start[y]) {
      dVar34 = 1.0;
    }
    dVar35 = dVar2 + 1.0;
    if (dVar33 + 1.0 <= dVar2 + 1.0) {
      dVar35 = dVar33 + 1.0;
    }
    dVar33 = dVar34 + *pdVar15;
    if (dVar35 <= dVar34 + *pdVar15) {
      dVar33 = dVar35;
    }
    uVar29 = -(ulong)((double)e < dVar33);
    return (double)(uVar29 & 0x7ff0000000000000 | ~uVar29 & (ulong)dVar33);
  }
  goto LAB_0010bf0f;
}

Assistant:

double TouzetDepthPruningTreeIndex<CostModel, TreeIndex>::tree_dist(
    const TreeIndex& t1, const TreeIndex& t2, const int x,
    const int y, const int k, const int e) {
  int x_size = t1.postl_to_size_[x];
  int y_size = t2.postl_to_size_[y];
  
  // std::cout << "TouzetDepthPruningTreeIndex::tree_dist" << std::endl;
  
  // Calculates offsets that let us translate i and j to correct postorder ids.
  int x_off = x - x_size;
  int y_off = y - y_size;

  // Initial cases.
  fd_.at(0, 0) = 0.0; // (0,0) is always within e-strip.
  for (int j = 1; j <= std::min(y_size, e); ++j) { // i = 0; only j that are within e-strip.
    fd_.at(0, j) = fd_.read_at(0, j - 1) + c_.ins(t2.postl_to_label_id_[j + y_off]);
  }
  if (e + 1 <= y_size) { // the first j that is outside e-strip
    fd_.at(0, e + 1) = std::numeric_limits<double>::infinity();
  }
  // QUESTION: Is it necessary to verify depths here?
  //           It is not, because these values will never be used. We write
  //           them not to verify the condition.
  for (int i = 1; i <= std::min(x_size, e); ++i) { // j = 0; only i that are within e-strip.
    fd_.at(i, 0) = fd_.read_at(i - 1, 0) + c_.del(t1.postl_to_label_id_[i + x_off]);
  }
  if (e + 1 <= x_size) { // the first i that is outside e-strip
    fd_.at(e + 1, 0) = std::numeric_limits<double>::infinity();
  }

  double candidate_result = std::numeric_limits<double>::infinity();

  // General cases.

  // NOTE: max_depth has to be set to min(depth(x)+e+1, max depth of T1_x)
  //       because e+1 may exceed the maximum depth of T1_x.
  // TODO: Figure out why e+1.
  int max_depth = std::min(t1.postl_to_depth_.at(x) + e + 1, t1.postl_to_subtree_max_depth_.at(x));

  int i = 1;
  int max_depth_it = 0;
  // Move max_depth_it to point to the first node within this subtree (T1_x).
  // TODO: This requires a scan of one depth inversted list. Can we do better?
  while (t1.inverted_list_depth_to_postl_.at(max_depth).at(max_depth_it) < i + x_off) {
    ++max_depth_it;
  }
  // Set the first i-value for the loop
  // TODO: Make this if more elegant.
  if (t1.postl_to_depth_.at(i + x_off) > max_depth) {
    // x_off has to be substructed to get correct i.
    i = t1.inverted_list_depth_to_postl_.at(max_depth).at(max_depth_it) - x_off;
    ++max_depth_it;
  } else if (t1.postl_to_depth_.at(i + x_off) == max_depth) {
    ++max_depth_it;
  }
  // Traversing truncated tree to filter out i-values based on depth.
  while (i <= x_size) {
    // Old if statement for filtering i-values based on depth.
    // if (t1_depth_[i + x_off] - t1_depth_[x] > e + 1) { continue; }
    if (i - e - 1 >= 1) { // First j that is outside e-strip.
      fd_.at(i, i - e - 1) = std::numeric_limits<double>::infinity();
    }
    for (int j = std::max(1, i - e); j <= std::min(i + e, y_size); ++j) { // only (i,j) that are in e-strip
      // The td(x_size-1, y_size-1) is computed differently.
      // TODO: This condition is evaluated too often but passes only on the
      //       last i and j.
      if (i == x_size && j == std::min(i + e, y_size)) {
        break;
      }
      ++subproblem_counter_;
      if (std::abs((i + x_off) - (j + y_off)) > k) {
        fd_.at(i, j) = std::numeric_limits<double>::infinity();
      } else {
        candidate_result = std::numeric_limits<double>::infinity();
        candidate_result = std::min(candidate_result, fd_.read_at(i, j - 1) +
            c_.ins(t2.postl_to_label_id_[j + y_off]));
        double td_read = td_.read_at(i + x_off, j + y_off);
        double fd_read = 0.0;
        // If one of the forests is a tree, look up the vlaues in fd_.
        // Otherwise, both forests are trees and the fd-part is empty.
        if (i - t1.postl_to_size_[i + x_off] != 0 || j - t2.postl_to_size_[j + y_off] != 0) {
          // If the values to read are outside of the band, they exceed
          // the threshold or are not present in the band-matrix.
          if (j - t2.postl_to_size_[j + y_off] < std::max(0, i - t1.postl_to_size_[i + x_off] - e - 1)) {
            fd_read = std::numeric_limits<double>::infinity();
          } else if (std::min(i - t1.postl_to_size_[i + x_off] + e + 1, y_size) < j - t2.postl_to_size_[j + y_off]) {
            fd_read = std::numeric_limits<double>::infinity();
          } else {
            fd_read = fd_.read_at(i - t1.postl_to_size_[i + x_off], j - t2.postl_to_size_[j + y_off]);
          }
        }
        candidate_result = std::min(candidate_result, fd_read + td_read);

        // Value at (i-1,j) may not be calculated due to truncated tree,
        // thus it has to be verified separately.
        // NOTE: For i=1 there may be an out of bound exception for depth
        //       lookup.
        if (i == 1 || (i > 1 && t1.postl_to_depth_.at(i - 1 + x_off) - t1.postl_to_depth_[x] <= e + 1)) {
          candidate_result = std::min(
            candidate_result,
            fd_.read_at(i - 1, j) + c_.del(t1.postl_to_label_id_[i + x_off])
          );
        }

        // None of the values in fd_ can be greater than e-value for this
        // subtree pair.
        if (candidate_result > e) {
          fd_.at(i, j) = std::numeric_limits<double>::infinity();
        } else {
          fd_.at(i, j) = candidate_result;
        }
      }
    }
    if (i + e + 1 <= y_size) { // Last j that is outside e-strip.
      fd_.at(i, i + e + 1) = std::numeric_limits<double>::infinity();
    }
    // Set next i to iterate.
    ++i;
    // NOTE: i <= x_size verifies depth and dil[max_depth] bounds.
    // NOTE: For i=x_size (subtree root) the depth is always smaller than
    //       max_depth.
    // TODO: Make this if more elegant.
    if (i <= x_size && t1.postl_to_depth_.at(i + x_off) > max_depth) {
      // If depth of i is greater than max_depth, there must be an ancestor
      // of i with depth equals max_depth, and max_depth_it points to it.
      // x_off has to be substructed to get correct i.
      i = t1.inverted_list_depth_to_postl_.at(max_depth).at(max_depth_it) - x_off;
      ++max_depth_it;
    } else if (i <= x_size && t1.postl_to_depth_.at(i + x_off) == max_depth) {
      ++max_depth_it;
    }
  }
  
  ++subproblem_counter_;
  // QUESTION: Is it possible that for some e-value an infinity should be
  //           returned, because the last subproblem is too far away?
  candidate_result = std::min({
    fd_.read_at(x_size - 1, y_size) + c_.del(t1.postl_to_label_id_[x]),                 // Delete root in source subtree.
    fd_.read_at(x_size, y_size - 1) + c_.ins(t2.postl_to_label_id_[y]),                 // Insert root in destination subtree.
    fd_.read_at(x_size - 1, y_size - 1) + c_.ren(t1.postl_to_label_id_[x], t2.postl_to_label_id_[y]) // Rename root nodes of the subtrees.
  });
  // The distance between two subtrees cannot be greater than e-value for these
  // subtrees.
  if (candidate_result > e) {
    return std::numeric_limits<double>::infinity();
  } else {
    return candidate_result;
  }
}